

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall asmjit::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  BaseBuilder *pBVar6;
  long *plVar7;
  RAStackSlot *pRVar8;
  BaseNode *pBVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  Error EVar12;
  ulong uVar13;
  VirtReg *pVVar14;
  long lVar15;
  BaseNode *node;
  Operand_ *this_00;
  uint uVar16;
  bool bVar17;
  BitWordIterator<unsigned_int> outIt;
  BitWordIterator<unsigned_int> useIt;
  ulong local_38;
  
  pBVar6 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  uVar3._0_1_ = pBVar6[1].super_BaseEmitter._environment._arch;
  uVar3._1_1_ = pBVar6[1].super_BaseEmitter._environment._subArch;
  uVar3._2_1_ = pBVar6[1].super_BaseEmitter._environment._vendor;
  uVar3._3_1_ = pBVar6[1].super_BaseEmitter._environment._platform;
  do {
    do {
      node = first;
      if (node == stop) {
        return 0;
      }
      first = (node->field_0).field_0._next;
    } while (((node->field_1)._any._nodeFlags & 0x20) == 0);
    plVar7 = (long *)node->_passData;
    local_38 = (ulong)(node->field_1)._any._reserved0;
    if (plVar7 != (long *)0x0) {
      uVar4 = *(uint *)((long)plVar7 + 0xc);
      uVar16 = 0;
      for (uVar13 = 0; uVar13 != uVar4; uVar13 = uVar13 + 1) {
        lVar15 = uVar13 * 0x18;
        useIt._bitWord = *(uint *)((long)plVar7 + lVar15 + 0x54);
        bVar2 = *(byte *)((long)plVar7 + lVar15 + 0x5d);
        while (useIt._bitWord != 0) {
          if (uVar16 <= bVar2) {
            uVar16 = (uint)bVar2;
          }
          uVar10 = Support::BitWordIterator<unsigned_int>::next(&useIt);
          *(uint *)((long)&node[1].field_0 + (ulong)uVar10 * 4 + 0xc) = (uint)bVar2;
        }
        outIt._bitWord = *(uint *)(plVar7 + uVar13 * 3 + 0xb);
        bVar2 = *(byte *)((long)plVar7 + lVar15 + 0x5e);
        while (outIt._bitWord != 0) {
          if (uVar16 <= bVar2) {
            uVar16 = (uint)bVar2;
          }
          uVar10 = Support::BitWordIterator<unsigned_int>::next(&outIt);
          *(uint *)((long)&node[1].field_0 + (ulong)uVar10 * 4 + 0xc) = (uint)bVar2;
        }
      }
      if (((int)plVar7[1] < 0) && (0xf < uVar16)) {
        iVar5 = *(int *)&node[1].field_0;
        if (iVar5 == 0x33a) {
          uVar11 = 0x33c;
        }
        else if (iVar5 == 0x5a0) {
          uVar11 = 0x5a1;
        }
        else if (iVar5 == 0x38a) {
          uVar11 = 0x38b;
        }
        else if (iVar5 == 0x38f) {
          uVar11 = 0x390;
        }
        else if (iVar5 == 0x40c) {
          uVar11 = 0x40d;
        }
        else if (iVar5 == 0x411) {
          uVar11 = 0x412;
        }
        else if (iVar5 == 0x42e) {
          uVar11 = 0x42f;
        }
        else if (iVar5 == 0x431) {
          uVar11 = 0x433;
        }
        else if (iVar5 == 0x46d) {
          uVar11 = 0x46e;
        }
        else if (iVar5 == 0x46f) {
          uVar11 = 0x470;
        }
        else if (iVar5 == 0x540) {
          uVar11 = 0x541;
        }
        else {
          if (iVar5 != 0x340) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/x86rapass.cpp"
                       ,0x4bc,"false");
          }
          uVar11 = 0x342;
        }
        *(undefined4 *)&node[1].field_0 = uVar11;
      }
      node->_passData = (void *)0x0;
      if ((node->field_1)._any._nodeType == '\x11') {
        lVar15 = *plVar7;
        bVar17 = BaseRAPass::isNextTo
                           (&this->super_BaseRAPass,node,
                            &((this->super_BaseRAPass)._func)->_exitNode->super_BaseNode);
        if (!bVar17) {
          ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
               (node->field_0).field_0._prev;
          useIt._bitWord = 4;
          EVar12 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                             (this,&useIt);
          if (EVar12 != 0) {
            return EVar12;
          }
        }
        pBVar9 = (node->field_0).field_0._prev;
        BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,node);
        *(BaseNode **)(lVar15 + 0x18) = pBVar9;
      }
    }
    this_00 = (Operand_ *)&node[1].field_1;
    while (bVar17 = local_38 != 0, local_38 = local_38 - 1, bVar17) {
      if ((this_00->_signature & 0x2007) == 0x2002) {
        uVar10 = this_00->_baseId - 0x100;
        if (uVar3 <= uVar10) {
          return 0x1f;
        }
        pVVar14 = BaseCompiler::virtRegByIndex
                            ((BaseCompiler *)(this->super_BaseRAPass).super_FuncPass.super_Pass._cb,
                             uVar10);
        if (pVVar14->_workReg == (RAWorkReg *)0x0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/x86rapass.cpp"
                     ,0x515,"workReg != nullptr");
        }
        pRVar8 = pVVar14->_workReg->_stackSlot;
        iVar5 = pRVar8->_offset;
        bVar2 = pRVar8->_baseRegId;
        Operand_::_setSignaturePart<248u>
                  (this_00,(this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature >> 3
                           & 0x1f);
        this_00->_baseId = (uint)bVar2;
        pbVar1 = (byte *)((long)&this_00->_signature + 1);
        *pbVar1 = *pbVar1 & 0xdf;
        this_00->_data[1] = this_00->_data[1] + iVar5;
      }
      this_00 = this_00 + 1;
    }
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // If the instruction contains pass data (raInst) then it was a subject
        // for register allocation and must be rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            // Transform VEX instruction to EVEX.
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // This data is allocated by Zone passed to `runOnFunction()`, which
        // will be reset after the RA pass finishes. So reset this data to
        // prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        if (ASMJIT_UNLIKELY(node->type() != BaseNode::kNodeInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit
          // label is next to it (optimization) or patched to an architecture
          // dependent jump instruction that jumps to the function's exit before
          // the epilog.
          if (node->type() == BaseNode::kNodeFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

    node = next;
  }

  return kErrorOk;
}